

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void node_accept_pattern(ACT_NODE_t *nod,AC_PATTERN_t *new_patt,int copy)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  mpool *pool;
  AC_ALPHABET_t *pAVar4;
  ac_pattid_type aVar5;
  undefined4 uVar6;
  size_t i;
  size_t sVar7;
  AC_PATTERN_t *pAVar8;
  AC_ALPHABET_t *pAVar9;
  anon_union_8_2_1f4d99a2_for_u aVar10;
  size_t sVar11;
  AC_TEXT_t *new_txt;
  size_t sVar12;
  
  sVar11 = nod->matched_size;
  sVar7 = 0;
  do {
    if (sVar7 == sVar11) {
      if (sVar11 == nod->matched_capacity) {
        if (sVar11 == 0) {
          nod->matched_capacity = 1;
          pAVar8 = (AC_PATTERN_t *)malloc(0x30);
          sVar11 = 0;
        }
        else {
          nod->matched_capacity = sVar11 + 2;
          pAVar8 = (AC_PATTERN_t *)realloc(nod->matched,(sVar11 + 2) * 0x30);
          sVar11 = nod->matched_size;
        }
        nod->matched = pAVar8;
      }
      else {
        pAVar8 = nod->matched;
      }
      nod->matched_size = sVar11 + 1;
      pAVar8 = pAVar8 + sVar11;
      if (copy == 0) {
        pAVar9 = (new_patt->ptext).astring;
        sVar11 = (new_patt->ptext).length;
        pAVar4 = (new_patt->rtext).astring;
        sVar7 = (new_patt->rtext).length;
        aVar5 = (new_patt->id).type;
        uVar6 = *(undefined4 *)&(new_patt->id).field_0xc;
        (pAVar8->id).u = (new_patt->id).u;
        (pAVar8->id).type = aVar5;
        *(undefined4 *)&(pAVar8->id).field_0xc = uVar6;
        (pAVar8->rtext).astring = pAVar4;
        (pAVar8->rtext).length = sVar7;
        (pAVar8->ptext).astring = pAVar9;
        (pAVar8->ptext).length = sVar11;
      }
      else {
        pool = nod->trie->mp;
        pAVar9 = (AC_ALPHABET_t *)
                 mpool_strndup(pool,(new_patt->ptext).astring,(new_patt->ptext).length);
        (pAVar8->ptext).astring = pAVar9;
        (pAVar8->ptext).length = (new_patt->ptext).length;
        pAVar9 = (AC_ALPHABET_t *)
                 mpool_strndup(pool,(new_patt->rtext).astring,(new_patt->rtext).length);
        (pAVar8->rtext).astring = pAVar9;
        (pAVar8->rtext).length = (new_patt->rtext).length;
        if ((new_patt->id).type == AC_PATTID_TYPE_STRING) {
          aVar10.stringy = (char *)mpool_strdup(pool,(new_patt->id).u.stringy);
        }
        else {
          aVar10 = (new_patt->id).u;
        }
        (pAVar8->id).u.stringy = (char *)aVar10;
        (pAVar8->id).type = (new_patt->id).type;
      }
      return;
    }
    sVar3 = nod->matched[sVar7].ptext.length;
    if (sVar3 == (new_patt->ptext).length) {
      sVar12 = 0;
      do {
        if (sVar3 == sVar12) {
          return;
        }
        pcVar1 = nod->matched[sVar7].ptext.astring + sVar12;
        pcVar2 = (new_patt->ptext).astring + sVar12;
        sVar12 = sVar12 + 1;
      } while (*pcVar1 == *pcVar2);
    }
    sVar7 = sVar7 + 1;
  } while( true );
}

Assistant:

void node_accept_pattern (ACT_NODE_t *nod, AC_PATTERN_t *new_patt, int copy)
{
    AC_PATTERN_t *patt;
    
    /* Check if the new pattern already exists in the node list */
    if (node_has_pattern(nod, new_patt))
        return;
    
    /* Manage memory */
    if (nod->matched_size == nod->matched_capacity)
        node_grow_matched_vector (nod);
    
    patt = &nod->matched[nod->matched_size++];
    
    if (copy)
    {
        /* Deep copy */
        node_copy_pattern (nod, patt, new_patt);
    }
    else
    {
        /* Shallow copy */
        *patt = *new_patt;
    }
}